

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV2
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  IO *pIVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  longdouble *plVar6;
  complex<double> *pcVar7;
  int *piVar8;
  unsigned_short *puVar9;
  complex<float> *pcVar10;
  short *psVar11;
  uint *puVar12;
  unsigned_long *puVar13;
  long *plVar14;
  uchar *puVar15;
  double *pdVar16;
  float *pfVar17;
  char *pcVar18;
  IO *this_00;
  BP5Deserializer *pBVar19;
  pointer array_00;
  pointer pbVar20;
  ostream *poVar21;
  DataType type;
  DataType type_00;
  int iVar22;
  string *psVar23;
  byte *pbVar24;
  ulong uVar25;
  long lVar26;
  size_t i;
  adios2 *this_01;
  allocator local_48a;
  allocator local_489;
  ulong local_488;
  BP5Deserializer *local_480;
  IO *local_478;
  string local_470;
  allocator local_449;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  string local_420;
  allocator local_3f9;
  ulong *local_3f8;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_488 = 0x10;
  uVar25 = 0;
  local_480 = this;
  local_3f8 = (ulong *)BaseData;
  do {
    pBVar19 = local_480;
    if (*local_3f8 <= uVar25) {
      local_488 = 0;
      while( true ) {
        if (local_3f8[2] <= local_488) break;
        lVar2 = local_3f8[3] + local_488 * 0x18;
        pcVar18 = *(char **)(local_3f8[3] + local_488 * 0x18);
        pIVar1 = (IO *)(pcVar18 + 1);
        if (*pcVar18 < 'C') {
          this_00 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pIVar1,&local_489);
          std::__cxx11::string::string
                    ((string *)&local_470,(char *)**(undefined8 **)(lVar2 + 0x10),&local_48a);
          std::__cxx11::string::string((string *)&array,"",&local_449);
          std::__cxx11::string::string((string *)&local_230,"/",&local_3f9);
          core::IO::DefineAttribute<std::__cxx11::string>
                    (this_00,&local_420,&local_470,(string *)&array,&local_230,true);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&array);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_420);
        }
        else {
          array.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          array.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          array.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_478 = pIVar1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&array,*(size_type *)(lVar2 + 8));
          lVar26 = 0;
          for (uVar25 = 0; uVar25 < *(ulong *)(lVar2 + 8); uVar25 = uVar25 + 1) {
            std::__cxx11::string::assign
                      ((char *)((long)&((array.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar26));
            lVar26 = lVar26 + 0x20;
          }
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)local_478,&local_489);
          pbVar20 = array.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          array_00 = array.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string((string *)&local_470,"",&local_48a);
          std::__cxx11::string::string((string *)&local_210,"/",&local_449);
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar1,&local_420,array_00,(long)pbVar20 - (long)array_00 >> 5,&local_470,
                     &local_210,true);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_420);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&array);
        }
        local_488 = local_488 + 1;
      }
switchD_005d7e22_caseD_52:
      return;
    }
    uVar4 = local_3f8[1];
    pbVar24 = *(byte **)((uVar4 - 0x10) + local_488);
    bVar3 = *pbVar24;
    iVar22 = (int)(char)bVar3;
    if (iVar22 < 0x43) {
      if (bVar3 - 0x31 < 0x10) {
        pbVar24 = pbVar24 + 1;
        switch((uint)bVar3) {
        case 0x31:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          pcVar18 = *(char **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_70;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<signed_char>(pIVar1,&local_420,pcVar18,&local_470,psVar23,true);
          break;
        case 0x32:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          psVar11 = *(short **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_90;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<short>(pIVar1,&local_420,psVar11,&local_470,psVar23,true);
          break;
        case 0x33:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          piVar8 = *(int **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_b0;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<int>(pIVar1,&local_420,piVar8,&local_470,psVar23,true);
          break;
        case 0x34:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          plVar14 = *(long **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_d0;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<long>(pIVar1,&local_420,plVar14,&local_470,psVar23,true);
          break;
        case 0x35:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          puVar15 = *(uchar **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_f0;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<unsigned_char>
                    (pIVar1,&local_420,puVar15,&local_470,psVar23,true);
          break;
        case 0x36:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          puVar9 = *(unsigned_short **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_110;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<unsigned_short>
                    (pIVar1,&local_420,puVar9,&local_470,psVar23,true);
          break;
        case 0x37:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          puVar12 = *(uint **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_130;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<unsigned_int>(pIVar1,&local_420,puVar12,&local_470,psVar23,true)
          ;
          break;
        case 0x38:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          puVar13 = *(unsigned_long **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_150;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<unsigned_long>
                    (pIVar1,&local_420,puVar13,&local_470,psVar23,true);
          break;
        case 0x39:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          pfVar17 = *(float **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_170;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<float>(pIVar1,&local_420,pfVar17,&local_470,psVar23,true);
          break;
        case 0x3a:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          pdVar16 = *(double **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_190;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<double>(pIVar1,&local_420,pdVar16,&local_470,psVar23,true);
          break;
        case 0x3b:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          plVar6 = *(longdouble **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_1b0;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<long_double>(pIVar1,&local_420,plVar6,&local_470,psVar23,true);
          break;
        case 0x3c:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          pcVar10 = *(complex<float> **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_1d0;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<std::complex<float>>
                    (pIVar1,&local_420,pcVar10,&local_470,psVar23,true);
          break;
        case 0x3d:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          pcVar7 = *(complex<double> **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_1f0;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<std::complex<double>>
                    (pIVar1,&local_420,pcVar7,&local_470,psVar23,true);
          break;
        case 0x3e:
          goto switchD_005d7ef0_caseD_3e;
        case 0x3f:
          pIVar1 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          pcVar18 = *(char **)(uVar4 + local_488);
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          psVar23 = &local_50;
          std::__cxx11::string::string((string *)psVar23,"/",&local_48a);
          core::IO::DefineAttribute<char>(pIVar1,&local_420,pcVar18,&local_470,psVar23,true);
          break;
        case 0x40:
          goto switchD_005d7e22_caseD_52;
        }
        std::__cxx11::string::~string((string *)psVar23);
        goto LAB_005d8ec6;
      }
switchD_005d7ef0_caseD_3e:
      poVar21 = std::operator<<((ostream *)&std::cout,"Loading attribute matched no type ");
      ToString_abi_cxx11_(&local_420,(adios2 *)(ulong)(iVar22 - 0x30),type_00);
      poVar21 = std::operator<<(poVar21,(string *)&local_420);
      std::endl<char,std::char_traits<char>>(poVar21);
    }
    else {
      this_01 = (adios2 *)(ulong)(iVar22 - 0x42);
      if (bVar3 - 0x43 < 0x10) {
        pbVar24 = pbVar24 + 1;
        switch((uint)bVar3) {
        case 0x43:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          pcVar18 = *(char **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_270,"/",&local_48a);
          psVar23 = &local_270;
          core::IO::DefineAttribute<signed_char>
                    (local_478,&local_420,pcVar18,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x44:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          psVar11 = *(short **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_290,"/",&local_48a);
          psVar23 = &local_290;
          core::IO::DefineAttribute<short>
                    (local_478,&local_420,psVar11,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x45:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          piVar8 = *(int **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_2b0,"/",&local_48a);
          psVar23 = &local_2b0;
          core::IO::DefineAttribute<int>
                    (local_478,&local_420,piVar8,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x46:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          plVar14 = *(long **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_2d0,"/",&local_48a);
          psVar23 = &local_2d0;
          core::IO::DefineAttribute<long>
                    (local_478,&local_420,plVar14,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x47:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          puVar15 = *(uchar **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_2f0,"/",&local_48a);
          psVar23 = &local_2f0;
          core::IO::DefineAttribute<unsigned_char>
                    (local_478,&local_420,puVar15,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x48:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          puVar9 = *(unsigned_short **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_310,"/",&local_48a);
          psVar23 = &local_310;
          core::IO::DefineAttribute<unsigned_short>
                    (local_478,&local_420,puVar9,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x49:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          puVar12 = *(uint **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_330,"/",&local_48a);
          psVar23 = &local_330;
          core::IO::DefineAttribute<unsigned_int>
                    (local_478,&local_420,puVar12,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x4a:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          puVar13 = *(unsigned_long **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_350,"/",&local_48a);
          psVar23 = &local_350;
          core::IO::DefineAttribute<unsigned_long>
                    (local_478,&local_420,puVar13,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x4b:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          pfVar17 = *(float **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_370,"/",&local_48a);
          psVar23 = &local_370;
          core::IO::DefineAttribute<float>
                    (local_478,&local_420,pfVar17,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x4c:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          pdVar16 = *(double **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_390,"/",&local_48a);
          psVar23 = &local_390;
          core::IO::DefineAttribute<double>
                    (local_478,&local_420,pdVar16,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x4d:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          plVar6 = *(longdouble **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_3b0,"/",&local_48a);
          psVar23 = &local_3b0;
          core::IO::DefineAttribute<long_double>
                    (local_478,&local_420,plVar6,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x4e:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          pcVar10 = *(complex<float> **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_3d0,"/",&local_48a);
          psVar23 = &local_3d0;
          core::IO::DefineAttribute<std::complex<float>>
                    (local_478,&local_420,pcVar10,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x4f:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          pcVar7 = *(complex<double> **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_3f0,"/",&local_48a);
          psVar23 = &local_3f0;
          core::IO::DefineAttribute<std::complex<double>>
                    (local_478,&local_420,pcVar7,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x50:
          goto switchD_005d7e22_caseD_50;
        case 0x51:
          local_478 = local_480->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_420,(char *)pbVar24,(allocator *)&array);
          uVar5 = *(ulong *)((uVar4 - 8) + local_488);
          pcVar18 = *(char **)(uVar4 + local_488);
          uVar4 = *(ulong *)((long)&pBVar19->_vptr_BP5Deserializer +
                            (long)(pBVar19->_vptr_BP5Deserializer[-3] + (long)this_01 * 8));
          std::__cxx11::string::string((string *)&local_470,"",&local_489);
          std::__cxx11::string::string((string *)&local_250,"/",&local_48a);
          psVar23 = &local_250;
          core::IO::DefineAttribute<char>
                    (local_478,&local_420,pcVar18,uVar5 / uVar4,&local_470,psVar23,true);
          break;
        case 0x52:
          goto switchD_005d7e22_caseD_52;
        }
        std::__cxx11::string::~string((string *)psVar23);
LAB_005d8ec6:
        std::__cxx11::string::~string((string *)&local_470);
      }
      else {
switchD_005d7e22_caseD_50:
        poVar21 = std::operator<<((ostream *)&std::cout,"Loading attribute matched no type ");
        ToString_abi_cxx11_(&local_420,this_01,type);
        poVar21 = std::operator<<(poVar21,(string *)&local_420);
        std::endl<char,std::char_traits<char>>(poVar21);
      }
    }
    std::__cxx11::string::~string((string *)&local_420);
    uVar25 = uVar25 + 1;
    local_488 = local_488 + 0x18;
  } while( true );
}

Assistant:

void BP5Deserializer::InstallAttributesV2(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    BP5AttrStruct *Attrs = (BP5AttrStruct *)BaseData;

    auto lf_BreakdownTypeArray = [](const char *Name, DataType &Type, bool &Array) {
        Type = (DataType)(Name[0] - '0');
        Array = false;
        if ((int)Type > 18)
        {
            Type = (DataType)((int)Type - 18);
            Array = true;
        }
    };

    for (size_t i = 0; i < Attrs->PrimAttrCount; i++)
    {
        PrimitiveTypeAttr *ThisAttr = &Attrs->PrimAttrs[i];
        bool Array;
        DataType Type;
        lf_BreakdownTypeArray(ThisAttr->Name, Type, Array);
        const char *Name = &ThisAttr->Name[1];
        if (Array)
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, (T *)ThisAttr->Values,                             \
                                          ThisAttr->TotalElementSize / DataTypeSize[(int)Type],    \
                                          "", "/", true);                                          \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        else
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, *(T *)ThisAttr->Values, "", "/", true);            \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
    }